

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O0

void __thiscall
kj::_::LogExpectation::logMessage
          (LogExpectation *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  bool bVar1;
  String *text_00;
  String *text_local;
  int contextDepth_local;
  int line_local;
  char *file_local;
  LogSeverity severity_local;
  LogExpectation *this_local;
  
  if ((((this->seen & 1U) == 0) && (severity == this->severity)) &&
     (bVar1 = String::contains(text,&this->substring), bVar1)) {
    this->seen = true;
  }
  else {
    text_00 = mv<kj::String>(text);
    ExceptionCallback::logMessage
              (&this->super_ExceptionCallback,severity,file,line,contextDepth,text_00);
  }
  return;
}

Assistant:

void LogExpectation::logMessage(
    LogSeverity severity, const char* file, int line, int contextDepth,
    String&& text) {
  if (!seen && severity == this->severity) {
    if (text.contains(substring)) {
      // Match. Ignore it.
      seen = true;
      return;
    }
  }

  // Pass up the chain.
  ExceptionCallback::logMessage(severity, file, line, contextDepth, kj::mv(text));
}